

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_3aed2::testWriteBadTypes(void)

{
  undefined1 in_stack_0000023f;
  string *in_stack_00000240;
  undefined7 in_stack_00000248;
  undefined1 in_stack_0000024f;
  string *in_stack_00000250;
  string *in_stack_00000258;
  char *in_stack_00000260;
  
  (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::DeepTiledInputFile,Imf_3_4::DeepTiledOutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::TiledOutputFile>
            (in_stack_00000260,in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f);
  (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
            (in_stack_00000260,in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::TiledOutputFile>
            (in_stack_00000260,in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f);
  (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
            (in_stack_00000260,in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f);
  (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::DeepTiledInputFile,Imf_3_4::DeepTiledOutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::TiledOutputFile>
            (in_stack_00000260,in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f);
  (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
            (in_stack_00000260,in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f);
  (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::DeepTiledInputFile,Imf_3_4::DeepTiledOutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::TiledOutputFile>
            (in_stack_00000260,in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f);
  (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
            (in_stack_00000260,in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f);
  (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::DeepTiledInputFile,Imf_3_4::DeepTiledOutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::TiledOutputFile>
            (in_stack_00000260,in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f);
  (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
            (in_stack_00000260,in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f);
  (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  (anonymous_namespace)::check<Imf_3_4::DeepTiledInputFile,Imf_3_4::DeepTiledOutputFile>
            ((char *)in_stack_00000250,(string *)CONCAT17(in_stack_0000024f,in_stack_00000248),
             in_stack_00000240,(bool)in_stack_0000023f);
  return;
}

Assistant:

void
testWriteBadTypes ()
{
    static const char* tmpfile = IMF_TMP_DIR "badfile.exr";

    // attributes should be added automatically for deep files
    check<DeepScanLineInputFile, DeepScanLineOutputFile> (
        tmpfile, NOTYPEATTR, DEEPSCANLINE, false);
    check<DeepTiledInputFile, DeepTiledOutputFile> (
        tmpfile, NOTYPEATTR, DEEPTILE, true);

    // attributes should NOT be added automatically for normal images
    check<InputFile, OutputFile> (tmpfile, NOTYPEATTR, NOTYPEATTR, false);
    check<InputFile, TiledOutputFile> (tmpfile, NOTYPEATTR, NOTYPEATTR, true);
    check<TiledInputFile, TiledOutputFile> (
        tmpfile, NOTYPEATTR, NOTYPEATTR, true);

    // if an attribute is provided, it should get changed to the correct one
    check<InputFile, OutputFile> (tmpfile, SCANLINEIMAGE, SCANLINEIMAGE, false);
    check<InputFile, TiledOutputFile> (
        tmpfile, SCANLINEIMAGE, TILEDIMAGE, true);
    check<TiledInputFile, TiledOutputFile> (
        tmpfile, SCANLINEIMAGE, TILEDIMAGE, true);
    check<DeepScanLineInputFile, DeepScanLineOutputFile> (
        tmpfile, SCANLINEIMAGE, DEEPSCANLINE, false);
    check<DeepTiledInputFile, DeepTiledOutputFile> (
        tmpfile, SCANLINEIMAGE, DEEPTILE, true);

    check<InputFile, OutputFile> (tmpfile, TILEDIMAGE, SCANLINEIMAGE, false);
    check<InputFile, TiledOutputFile> (tmpfile, TILEDIMAGE, TILEDIMAGE, true);
    check<TiledInputFile, TiledOutputFile> (
        tmpfile, TILEDIMAGE, TILEDIMAGE, true);
    check<DeepScanLineInputFile, DeepScanLineOutputFile> (
        tmpfile, TILEDIMAGE, DEEPSCANLINE, false);
    check<DeepTiledInputFile, DeepTiledOutputFile> (
        tmpfile, TILEDIMAGE, DEEPTILE, true);

    check<InputFile, OutputFile> (tmpfile, DEEPSCANLINE, SCANLINEIMAGE, false);
    check<InputFile, TiledOutputFile> (tmpfile, DEEPSCANLINE, TILEDIMAGE, true);
    check<TiledInputFile, TiledOutputFile> (
        tmpfile, DEEPSCANLINE, TILEDIMAGE, true);
    check<DeepScanLineInputFile, DeepScanLineOutputFile> (
        tmpfile, DEEPSCANLINE, DEEPSCANLINE, false);
    check<DeepTiledInputFile, DeepTiledOutputFile> (
        tmpfile, DEEPSCANLINE, DEEPTILE, true);

    check<InputFile, OutputFile> (tmpfile, DEEPTILE, SCANLINEIMAGE, false);
    check<InputFile, TiledOutputFile> (tmpfile, DEEPTILE, TILEDIMAGE, true);
    check<TiledInputFile, TiledOutputFile> (
        tmpfile, DEEPTILE, TILEDIMAGE, true);
    check<DeepScanLineInputFile, DeepScanLineOutputFile> (
        tmpfile, DEEPTILE, DEEPSCANLINE, false);
    check<DeepTiledInputFile, DeepTiledOutputFile> (
        tmpfile, DEEPTILE, DEEPTILE, true);
}